

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Utils::split_string(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *__return_storage_ptr__,string *string,char delimiter)

{
  bool bVar1;
  istream *piVar2;
  istringstream local_1c0 [8];
  istringstream dataStream;
  undefined1 local_40 [8];
  string data;
  char delimiter_local;
  string *string_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *splitted_strings;
  
  data.field_2._M_local_buf[0xe] = '\0';
  data.field_2._M_local_buf[0xf] = delimiter;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_40);
  std::__cxx11::istringstream::istringstream(local_1c0,(string *)string,_S_in);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1c0,(string *)local_40,data.field_2._M_local_buf[0xf]);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_40);
  }
  data.field_2._M_local_buf[0xe] = '\x01';
  std::__cxx11::istringstream::~istringstream(local_1c0);
  std::__cxx11::string::~string((string *)local_40);
  if ((data.field_2._M_local_buf[0xe] & 1U) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Utils::split_string(const std::string& string, char delimiter)
{
    std::vector<std::string> splitted_strings;
    std::string data;
    std::istringstream dataStream(string);
    while (std::getline(dataStream, data, delimiter))
    {
        splitted_strings.push_back(data);
    }
    return splitted_strings;
}